

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

int prvTidytmbstrncmp(ctmbstr s1,ctmbstr s2,uint n)

{
  uint local_24;
  uint c;
  uint n_local;
  ctmbstr s2_local;
  ctmbstr s1_local;
  
  if ((s1 == (ctmbstr)0x0) || (local_24 = n, _c = s2, s2_local = s1, s2 == (ctmbstr)0x0)) {
    if (s1 == s2) {
      s1_local._4_4_ = 0;
    }
    else {
      s1_local._4_4_ = 1;
      if (s1 == (ctmbstr)0x0) {
        s1_local._4_4_ = -1;
      }
    }
  }
  else {
    for (; *s2_local == *_c; s2_local = s2_local + 1) {
      if (*s2_local == '\0') {
        return 0;
      }
      if (local_24 == 0) {
        return 0;
      }
      _c = _c + 1;
      local_24 = local_24 - 1;
    }
    if (local_24 == 0) {
      s1_local._4_4_ = 0;
    }
    else {
      s1_local._4_4_ = -1;
      if (*_c < *s2_local) {
        s1_local._4_4_ = 1;
      }
    }
  }
  return s1_local._4_4_;
}

Assistant:

int TY_(tmbstrncmp)( ctmbstr s1, ctmbstr s2, uint n )
{
    uint c;

	if (s1 == NULL || s2 == NULL)
    {
        if (s1 == s2)
            return 0;
        return (s1 == NULL ? -1 : 1);
    }

    while ((c = (byte)*s1) == (byte)*s2)
    {
        if (c == '\0')
            return 0;

        if (n == 0)
            return 0;

        ++s1;
        ++s2;
        --n;
    }

    if (n == 0)
        return 0;

    return (*s1 > *s2 ? 1 : -1);
}